

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall TcpSocketTest::handleData(TcpSocketTest *this)

{
  Socket *in_RSI;
  
  handleData((TcpSocketTest *)&this[-1].super_TestCase.mTestName._M_string_length,in_RSI);
  return;
}

Assistant:

void TcpSocketTest::handleData( Socket *s )
{
  //cerr << "data" << endl;
	LOG_NOTICE( "called" );
	uint32_t num;
	
	// if no_echo is true, you can use nc to play
	// around.
	if(no_echo)
	{
	  char buf[BUF_SIZE+1];
	  for( int i = 0; i < BUF_SIZE+1; i++)
	    buf[i] = 0;
	  
	  int res = s->read(buf, BUF_SIZE);
	  //cerr << buf << endl;

	  res = s->write(buf, BUF_SIZE);
	  //cerr << "Bytes sent: " << res << endl;
       
	  return;
	}

	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );
	//cerr << num << endl;
	num += 1;

	// Set delay to ture, to test timeout stuff
	if (delay)
	{
	  struct timespec t;
	  t.tv_sec = 0;
	  t.tv_nsec = 200000;
	  nanosleep( &t, NULL );
	}

	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );
}